

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

MemoryObject_conflict * __thiscall
vkt::memory::anon_unknown_0::MemoryHeap::allocateRandom
          (MemoryHeap *this,DeviceInterface *vkd,VkDevice device,Random *rng)

{
  VkDeviceSize VVar1;
  TotalMemoryTracker *this_00;
  VkMemoryType VVar2;
  MemoryClass MVar3;
  ulong uVar4;
  VkMemoryType VVar5;
  const_reference pvVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  iterator first;
  MemoryObject_conflict *this_01;
  unsigned_long local_250;
  unsigned_long local_240;
  size_t local_220;
  unsigned_long local_1f8;
  unsigned_long local_1e8;
  MemoryObject_conflict *local_1d0;
  MemoryObject_conflict *object;
  ulong local_1c0;
  unsigned_long local_1b8;
  VkDeviceSize local_1b0;
  VkDeviceSize referenceMemoryUsage;
  VkDeviceSize memoryUsage;
  VkDeviceSize size;
  VkDeviceSize allocationSizeGranularity;
  VkDeviceSize atomSize;
  VkDeviceSize maxAllocationSize;
  MemoryType type;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> local_160;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> local_148;
  unsigned_long local_130;
  unsigned_long local_128;
  VkDeviceSize maxAllocationSize_2;
  VkDeviceSize usedMemClass;
  VkDeviceSize totalMemClass;
  VkDeviceSize totalSysMem_1;
  VkDeviceSize totalUsage_1;
  ulong local_e8;
  unsigned_long local_e0;
  VkDeviceSize maxAllocationSize_1;
  VkDeviceSize availableBits;
  VkDeviceSize totalSysMem;
  VkDeviceSize local_b8;
  VkDeviceSize totalUsage;
  unsigned_long local_a8;
  ulong local_a0;
  VkDeviceSize minReferenceSize;
  VkDeviceSize minAllocationSize;
  VkDeviceSize allocationSizeGranularity_1;
  VkDeviceSize atomSize_1;
  MemoryType type_1;
  size_t memoryTypeNdx;
  MemoryClass memClass;
  bool isUMA;
  VkDeviceSize availableInHeap;
  vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
  memoryTypes;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> memoryTypeMaxSizePair;
  Random *rng_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  MemoryHeap *this_local;
  
  std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>::
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long,_true>
            ((pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> *)
             &memoryTypes.
              super__Vector_base<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
  ::vector((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
            *)&availableInHeap);
  uVar4 = ((this->m_heap).size >> 1) - this->m_usage;
  VVar1 = this->m_limits->totalDeviceLocalMemory;
  MVar3 = getMemoryClass(this);
  type_1.type.propertyFlags = 0;
  type_1.type.heapIndex = 0;
  for (; VVar2 = type_1.type,
      VVar5 = (VkMemoryType)
              std::
              vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
              ::size(&this->m_memoryTypes), (ulong)VVar2 < (ulong)VVar5;
      type_1.type = (VkMemoryType)((long)type_1.type + 1)) {
    pvVar6 = std::
             vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
             ::operator[](&this->m_memoryTypes,(size_type)type_1.type);
    atomSize_1._4_4_ = pvVar6->index;
    unique0x00012004 = (pvVar6->type).propertyFlags;
    type_1.index = (pvVar6->type).heapIndex;
    if ((unique0x00012000 & 0x400000000) == 0) {
      local_1e8 = this->m_nonCoherentAtomSize;
    }
    else {
      local_1e8 = 1;
    }
    allocationSizeGranularity_1 = local_1e8;
    if (MVar3 == MEMORY_CLASS_DEVICE) {
      local_1f8 = this->m_limits->devicePageSize;
    }
    else {
      local_1f8 = getHostPageSize();
    }
    uVar7 = de::max<unsigned_long>(local_1e8,local_1f8);
    local_a8 = 8;
    minReferenceSize = uVar7;
    minAllocationSize = uVar7;
    uVar8 = divRoundUp<unsigned_long>(&minReferenceSize,&local_a8);
    totalUsage = allocationSizeGranularity_1 << 3;
    uVar9 = divRoundUp<unsigned_long>(&minReferenceSize,&totalUsage);
    local_a0 = uVar7 + uVar8 + uVar9;
    if (VVar1 == 0) {
      local_b8 = TotalMemoryTracker::getTotalUsage(this->m_totalMemTracker);
      availableBits = this->m_limits->totalSystemMemory;
      maxAllocationSize_1 = (availableBits - local_b8) * 8;
      local_e8 = (allocationSizeGranularity_1 * maxAllocationSize_1) /
                 (allocationSizeGranularity_1 * 0x11 + 1);
      local_e0 = roundDownToMultiple<unsigned_long>(&local_e8,&minAllocationSize);
      if ((minReferenceSize + local_a0 <= availableBits - local_b8) && (minReferenceSize <= uVar4))
      {
        std::make_pair<vkt::memory::(anonymous_namespace)::MemoryType_const&,unsigned_long_const&>
                  ((pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> *)
                   &totalUsage_1,(MemoryType *)((long)&atomSize_1 + 4),&local_e0);
        std::
        vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
        ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                     *)&availableInHeap,(value_type *)&totalUsage_1);
      }
    }
    else {
      totalSysMem_1 = TotalMemoryTracker::getTotalUsage(this->m_totalMemTracker);
      totalMemClass = this->m_limits->totalSystemMemory;
      if (MVar3 == MEMORY_CLASS_SYSTEM) {
        local_220 = this->m_limits->totalSystemMemory;
      }
      else {
        local_220 = this->m_limits->totalDeviceLocalMemory;
      }
      usedMemClass = local_220;
      maxAllocationSize_2 = TotalMemoryTracker::getUsage(this->m_totalMemTracker,MVar3);
      local_130 = de::min<unsigned_long>
                            (usedMemClass - maxAllocationSize_2,
                             (allocationSizeGranularity_1 * (totalMemClass - totalSysMem_1) * 8) /
                             (allocationSizeGranularity_1 * 9 + 1));
      local_128 = roundDownToMultiple<unsigned_long>(&local_130,&minAllocationSize);
      if (((minReferenceSize <= uVar4) && (minReferenceSize <= usedMemClass - maxAllocationSize_2))
         && (local_a0 <= totalMemClass - totalSysMem_1)) {
        std::make_pair<vkt::memory::(anonymous_namespace)::MemoryType_const&,unsigned_long_const&>
                  (&local_148,(MemoryType *)((long)&atomSize_1 + 4),&local_128);
        std::
        vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
        ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                     *)&availableInHeap,&local_148);
      }
    }
  }
  first = std::
          vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
          ::begin((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                   *)&availableInHeap);
  type.type = (VkMemoryType)
              std::
              vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ::end((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                     *)&availableInHeap);
  de::Random::
  choose<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>,__gnu_cxx::__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>*,std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>,std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>>>>>
            (&local_160,rng,
             (__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
              )type.type);
  std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>::operator=
            ((pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> *)
             &memoryTypes.
              super__Vector_base<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
  std::
  vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
  ::~vector((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
             *)&availableInHeap);
  stack0xfffffffffffffe84 =
       memoryTypes.
       super__Vector_base<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  atomSize = (ulong)memoryTypeMaxSizePair._8_8_ >> 1;
  if (((ulong)memoryTypes.
              super__Vector_base<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x400000000) == 0) {
    local_240 = this->m_nonCoherentAtomSize;
  }
  else {
    local_240 = 1;
  }
  allocationSizeGranularity = local_240;
  MVar3 = getMemoryClass(this);
  if (MVar3 == MEMORY_CLASS_DEVICE) {
    local_250 = this->m_limits->devicePageSize;
  }
  else {
    local_250 = getHostPageSize();
  }
  size = de::max<unsigned_long>(local_240,local_250);
  memoryUsage = randomSize(rng,allocationSizeGranularity,atomSize);
  referenceMemoryUsage = roundUpToMultiple<unsigned_long>(&memoryUsage,&size);
  VVar1 = memoryUsage;
  local_1b8 = 8;
  uVar7 = divRoundUp<unsigned_long>(&memoryUsage,&local_1b8);
  local_1c0 = memoryUsage / allocationSizeGranularity;
  object = (MemoryObject_conflict *)0x8;
  uVar8 = divRoundUp<unsigned_long>(&local_1c0,(unsigned_long *)&object);
  local_1b0 = VVar1 + uVar7 + uVar8;
  this_01 = (MemoryObject_conflict *)operator_new(0xb0);
  MemoryObject::MemoryObject
            ((MemoryObject *)this_01,vkd,device,memoryUsage,maxAllocationSize._4_4_,
             allocationSizeGranularity,referenceMemoryUsage,local_1b0);
  this->m_usage = referenceMemoryUsage + this->m_usage;
  this_00 = this->m_totalMemTracker;
  local_1d0 = this_01;
  MVar3 = getMemoryClass(this);
  TotalMemoryTracker::allocate(this_00,MVar3,referenceMemoryUsage);
  TotalMemoryTracker::allocate(this->m_totalMemTracker,MEMORY_CLASS_SYSTEM,local_1b0);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  ::push_back(&this->m_objects,&local_1d0);
  return local_1d0;
}

Assistant:

MemoryObject* MemoryHeap::allocateRandom (const DeviceInterface& vkd, VkDevice device, de::Random& rng)
{
	pair<MemoryType, VkDeviceSize> memoryTypeMaxSizePair;

	// Pick random memory type
	{
		vector<pair<MemoryType, VkDeviceSize> > memoryTypes;

		const VkDeviceSize	availableInHeap		= m_heap.size/MAX_MEMORY_USAGE_DIV - m_usage;
		const bool			isUMA				= m_limits.totalDeviceLocalMemory == 0;
		const MemoryClass	memClass			= getMemoryClass();

		// Collect memory types that can be allocated and the maximum size of allocation.
		// Memory type can be only allocated if minimal memory allocation is less than available memory.
		for (size_t memoryTypeNdx = 0; memoryTypeNdx < m_memoryTypes.size(); memoryTypeNdx++)
		{
			const MemoryType	type						= m_memoryTypes[memoryTypeNdx];
			const VkDeviceSize	atomSize					= (type.type.propertyFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT) != 0
															? 1
															: m_nonCoherentAtomSize;
			const VkDeviceSize	allocationSizeGranularity	= de::max(atomSize, memClass == MEMORY_CLASS_DEVICE ? m_limits.devicePageSize : getHostPageSize());
			const VkDeviceSize	minAllocationSize			= allocationSizeGranularity;
			const VkDeviceSize	minReferenceSize			= minAllocationSize
															+ divRoundUp<VkDeviceSize>(minAllocationSize,  8)
															+ divRoundUp<VkDeviceSize>(minAllocationSize,  atomSize * 8);

			if (isUMA)
			{
				// Max memory size calculation is little tricky since reference memory requires 1/n bits per byte.
				const VkDeviceSize	totalUsage				= m_totalMemTracker.getTotalUsage();
				const VkDeviceSize	totalSysMem				= (VkDeviceSize)m_limits.totalSystemMemory;
				const VkDeviceSize	availableBits			= (totalSysMem - totalUsage) * 8;
				// availableBits == maxAllocationSizeBits + maxAllocationReferenceSizeBits
				// maxAllocationReferenceSizeBits == maxAllocationSizeBits + (maxAllocationSizeBits / 8) + (maxAllocationSizeBits / atomSizeBits)
				// availableBits == maxAllocationSizeBits + maxAllocationSizeBits + (maxAllocationSizeBits / 8) + (maxAllocationSizeBits / atomSizeBits)
				// availableBits == 2 * maxAllocationSizeBits + (maxAllocationSizeBits / 8) + (maxAllocationSizeBits / atomSizeBits)
				// availableBits == (2 + 1/8 + 1/atomSizeBits) * maxAllocationSizeBits
				// 8 * availableBits == (16 + 1 + 8/atomSizeBits) * maxAllocationSizeBits
				// atomSizeBits * 8 * availableBits == (17 * atomSizeBits + 8) * maxAllocationSizeBits
				// maxAllocationSizeBits == atomSizeBits * 8 * availableBits / (17 * atomSizeBits + 8)
				// maxAllocationSizeBytes == maxAllocationSizeBits / 8
				// maxAllocationSizeBytes == atomSizeBits * availableBits / (17 * atomSizeBits + 8)
				// atomSizeBits = atomSize * 8
				// maxAllocationSizeBytes == atomSize * 8 * availableBits / (17 * atomSize * 8 + 8)
				// maxAllocationSizeBytes == atomSize * availableBits / (17 * atomSize + 1)
				const VkDeviceSize	maxAllocationSize		= roundDownToMultiple(((atomSize * availableBits) / (17 * atomSize + 1)), allocationSizeGranularity);

				DE_ASSERT(totalUsage <= totalSysMem);
				DE_ASSERT(maxAllocationSize <= totalSysMem);

				if (minAllocationSize + minReferenceSize <= (totalSysMem - totalUsage) && minAllocationSize <= availableInHeap)
				{
					DE_ASSERT(maxAllocationSize >= minAllocationSize);
					memoryTypes.push_back(std::make_pair(type, maxAllocationSize));
				}
			}
			else
			{
				// Max memory size calculation is little tricky since reference memory requires 1/n bits per byte.
				const VkDeviceSize	totalUsage			= m_totalMemTracker.getTotalUsage();
				const VkDeviceSize	totalSysMem			= (VkDeviceSize)m_limits.totalSystemMemory;

				const VkDeviceSize	totalMemClass		= memClass == MEMORY_CLASS_SYSTEM
														? m_limits.totalSystemMemory
														: m_limits.totalDeviceLocalMemory;
				const VkDeviceSize	usedMemClass		= m_totalMemTracker.getUsage(memClass);
				// availableRefBits = maxRefBits + maxRefBits/8 + maxRefBits/atomSizeBits
				// availableRefBits = maxRefBits * (1 + 1/8 + 1/atomSizeBits)
				// 8 * availableRefBits = maxRefBits * (8 + 1 + 8/atomSizeBits)
				// 8 * atomSizeBits * availableRefBits = maxRefBits * (9 * atomSizeBits + 8)
				// maxRefBits = 8 * atomSizeBits * availableRefBits / (9 * atomSizeBits + 8)
				// atomSizeBits = atomSize * 8
				// maxRefBits = 8 * atomSize * 8 * availableRefBits / (9 * atomSize * 8 + 8)
				// maxRefBits = atomSize * 8 * availableRefBits / (9 * atomSize + 1)
				// maxRefBytes = atomSize * availableRefBits / (9 * atomSize + 1)
				const VkDeviceSize	maxAllocationSize	= roundDownToMultiple(de::min(totalMemClass - usedMemClass, (atomSize * 8 * (totalSysMem - totalUsage)) / (9 * atomSize + 1)), allocationSizeGranularity);

				DE_ASSERT(usedMemClass <= totalMemClass);

				if (minAllocationSize <= availableInHeap
						&& minAllocationSize <= (totalMemClass - usedMemClass)
						&& minReferenceSize <= (totalSysMem - totalUsage))
				{
					DE_ASSERT(maxAllocationSize >= minAllocationSize);
					memoryTypes.push_back(std::make_pair(type, maxAllocationSize));
				}

			}
		}

		memoryTypeMaxSizePair = rng.choose<pair<MemoryType, VkDeviceSize> >(memoryTypes.begin(), memoryTypes.end());
	}

	const MemoryType		type						= memoryTypeMaxSizePair.first;
	const VkDeviceSize		maxAllocationSize			= memoryTypeMaxSizePair.second / MAX_MEMORY_ALLOC_DIV;
	const VkDeviceSize		atomSize					= (type.type.propertyFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT) != 0
														? 1
														: m_nonCoherentAtomSize;
	const VkDeviceSize		allocationSizeGranularity	= de::max(atomSize, getMemoryClass() == MEMORY_CLASS_DEVICE ? m_limits.devicePageSize : getHostPageSize());
	const VkDeviceSize		size						= randomSize(rng, atomSize, maxAllocationSize);
	const VkDeviceSize		memoryUsage					= roundUpToMultiple(size, allocationSizeGranularity);
	const VkDeviceSize		referenceMemoryUsage		= size + divRoundUp<VkDeviceSize>(size, 8) + divRoundUp<VkDeviceSize>(size / atomSize, 8);

	DE_ASSERT(size <= maxAllocationSize);

	MemoryObject* const		object	= new MemoryObject(vkd, device, size, type.index, atomSize, memoryUsage, referenceMemoryUsage);

	m_usage += memoryUsage;
	m_totalMemTracker.allocate(getMemoryClass(), memoryUsage);
	m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, referenceMemoryUsage);
	m_objects.push_back(object);

	return object;
}